

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O2

bool loadHelperWiAngleProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program;
  char buf [1024];
  
  program = djgp_create();
  fwrite("Loading {Wi-Angle-Helper-Program}\n",0x22,1,_stdout);
  fflush(_stdout);
  djgp_push_string(program,"#define BUFFER_BINDING_TRANSFORMS %i\n",1);
  djgp_push_string(program,"#define VERTEX_CNT %i\n",(ulong)(uint)g_sphere.circles.vertexCnt);
  strcat2(buf,g_app.dir.shader,"wi_angle.glsl");
  djgp_push_file(program,buf);
  bVar1 = djgp_to_gl(program,0x1c2,false,true,g_gl.programs + 6);
  if (bVar1) {
    djgp_release(program);
    g_gl.uniforms[0xd] = (*glad_glGetUniformLocation)(g_gl.programs[6],"u_Dir");
    configureHelperWiAngleProgram();
    GVar2 = (*glad_glGetError)();
    bVar1 = GVar2 == 0;
  }
  else {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    djgp_release(program);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool loadHelperWiAngleProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_HELPER_WI_ANGLE];
    char buf[1024];

    LOG("Loading {Wi-Angle-Helper-Program}\n");
    djgp_push_string(djp, "#define BUFFER_BINDING_TRANSFORMS %i\n", STREAM_TRANSFORM);
    djgp_push_string(djp, "#define VERTEX_CNT %i\n", g_sphere.circles.vertexCnt);
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "wi_angle.glsl"));

    if (!djgp_to_gl(djp, 450, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_HELPER_WI_ANGLE_DIR] =
        glGetUniformLocation(g_gl.programs[PROGRAM_HELPER_WI_ANGLE], "u_Dir");

    configureHelperWiAngleProgram();

    return (glGetError() == GL_NO_ERROR);
}